

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O0

QAsn1Element * QAsn1Element::fromInteger(uint val)

{
  long lVar1;
  uint in_ESI;
  QAsn1Element *in_RDI;
  long in_FS_OFFSET;
  QAsn1Element *elem;
  quint8 in_stack_ffffffffffffffbf;
  uint local_2c;
  QAsn1Element *pQVar2;
  char c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  (in_RDI->mValue).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->mValue).d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->mValue).d.size = -0x5555555555555556;
  pQVar2 = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x11ac46);
  QAsn1Element(in_RDI,in_stack_ffffffffffffffbf,(QByteArray *)0x11ac5a);
  QByteArray::~QByteArray((QByteArray *)0x11ac64);
  for (local_2c = in_ESI; c = (char)((ulong)pQVar2 >> 0x38), 0x7f < local_2c;
      local_2c = local_2c >> 8) {
    QByteArray::prepend((QByteArray *)in_RDI,c);
  }
  QByteArray::prepend((QByteArray *)in_RDI,c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QAsn1Element QAsn1Element::fromInteger(unsigned int val)
{
    QAsn1Element elem(QAsn1Element::IntegerType);
    while (val > 127) {
        elem.mValue.prepend(val & 0xff);
        val >>= 8;
    }
    elem.mValue.prepend(val & 0x7f);
    return elem;
}